

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O3

size_t cmsysBase64_Decode(uchar *input,size_t length,uchar *output,size_t max_input_length)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uchar *dest;
  uchar temp [3];
  uchar temp_1 [3];
  uchar local_2e;
  uchar local_2d;
  uchar local_2b [3];
  
  dest = output;
  if (max_input_length == 0) {
    do {
      puVar3 = output + (length - (long)dest);
      if ((long)puVar3 < 3) {
        if (puVar3 == (uchar *)0x1) {
          iVar2 = cmsysBase64_Decode3(input,local_2b);
          if (iVar2 == 0) break;
        }
        else {
          if (puVar3 != (uchar *)0x2) break;
          uVar1 = cmsysBase64_Decode3(input,&local_2e);
          if (1 < uVar1) {
            *dest = local_2e;
            dest[1] = local_2d;
            dest = dest + 2;
            break;
          }
          local_2b[0] = local_2e;
          if (uVar1 != 1) break;
        }
        *dest = local_2b[0];
        dest = dest + 1;
        break;
      }
      uVar1 = cmsysBase64_Decode3(input,dest);
      dest = dest + uVar1;
      input = input + 4;
    } while (uVar1 == 3);
  }
  else {
    puVar3 = input + max_input_length;
    do {
      if (puVar3 <= input) break;
      uVar1 = cmsysBase64_Decode3(input,dest);
      dest = dest + uVar1;
      input = input + 4;
    } while (uVar1 == 3);
  }
  return (long)dest - (long)output;
}

Assistant:

size_t kwsysBase64_Decode(const unsigned char* input, size_t length,
                          unsigned char* output, size_t max_input_length)
{
  const unsigned char* ptr = input;
  unsigned char* optr = output;

  /* Decode complete triplet */

  if (max_input_length) {
    const unsigned char* end = input + max_input_length;
    while (ptr < end) {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if (len < 3) {
        return (size_t)(optr - output);
      }
      ptr += 4;
    }
  } else {
    unsigned char* oend = output + length;
    while ((oend - optr) >= 3) {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if (len < 3) {
        return (size_t)(optr - output);
      }
      ptr += 4;
    }

    /* Decode the last triplet */

    if (oend - optr == 2) {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if (len >= 2) {
        optr[0] = temp[0];
        optr[1] = temp[1];
        optr += 2;
      } else if (len > 0) {
        optr[0] = temp[0];
        optr += 1;
      }
    } else if (oend - optr == 1) {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if (len > 0) {
        optr[0] = temp[0];
        optr += 1;
      }
    }
  }

  return (size_t)(optr - output);
}